

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::printIntensity(Station *this,bool vector_form)

{
  double dVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  undefined7 in_register_00000031;
  long lVar5;
  long lVar6;
  
  if ((int)CONCAT71(in_register_00000031,vector_form) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Angle ",6);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->angle);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," aperture intensities: ",0x17);
    std::ostream::_M_insert<double>
              ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1]);
    if (1 < this->max_apertures) {
      lVar6 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        std::ostream::_M_insert<double>
                  ((this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->max_apertures);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," intensity matrix:",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar2 = Collimator::getXdim(this->collimator);
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        iVar2 = Collimator::getYdim(this->collimator);
        if (0 < iVar2) {
          lVar5 = 0;
          do {
            printf("%2.0f ",(this->I).p[lVar6][lVar5]);
            lVar5 = lVar5 + 1;
            iVar2 = Collimator::getYdim(this->collimator);
          } while (lVar5 < iVar2);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        lVar6 = lVar6 + 1;
        iVar2 = Collimator::getXdim(this->collimator);
      } while (lVar6 < iVar2);
    }
  }
  else {
    iVar2 = Collimator::getXdim(this->collimator);
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        iVar2 = Collimator::getYdim(this->collimator);
        if (0 < iVar2) {
          lVar5 = 0;
          do {
            dVar1 = (this->I).p[lVar6][lVar5];
            if ((dVar1 != -1.0) || (NAN(dVar1))) {
              printf("\t%2.1f");
            }
            lVar5 = lVar5 + 1;
            iVar2 = Collimator::getYdim(this->collimator);
          } while (lVar5 < iVar2);
        }
        lVar6 = lVar6 + 1;
        iVar2 = Collimator::getXdim(this->collimator);
      } while (lVar6 < iVar2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nb_intensities:",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void Station::printIntensity(bool vector_form) {
	  if(!vector_form){
		  cout << "Angle "<< angle << endl; 
	    cout << " aperture intensities: ";
	    cout << intensity[1];
	    for (int i=1;i<max_apertures;i++)
	      cout << ", " << intensity[i];
	    cout << endl <<" intensity matrix:"<< endl;
		  for (int i=0; i<collimator.getXdim();i++) {
			  for (int j=0; j<collimator.getYdim(); j++) {
				  printf("%2.0f ", I(i,j));
			  }
			  cout << endl;
		  }
	  }else{
		  for (int i=0; i<collimator.getXdim();i++) {
			  for (int j=0; j<collimator.getYdim(); j++) {
				  if(I(i,j)!=-1.0) printf("\t%2.1f", I(i,j));
			  }
		  }
	  }

    cout << "nb_intensities:" << int2nb.size() << endl;
  }